

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O3

void test_zeroing<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
               (void)

{
  node_ptr plVar1;
  node_ptr plVar2;
  pointer puVar3;
  Column_zp_settings *pCVar4;
  node_ptr plVar5;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  orderedBoundaries;
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  m;
  shared_count sStack_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined **local_2d8;
  undefined1 local_2d0;
  undefined8 *local_2c8;
  char **local_2c0;
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  local_2b8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  undefined1 *local_200;
  undefined1 *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  Column_zp_settings *local_180;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  local_178;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
            ();
  pCVar4 = (Column_zp_settings *)operator_new(0x58);
  Gudhi::persistence_matrix::
  Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>
  ::Column_zp_settings::Column_zp_settings(pCVar4,5);
  local_180 = pCVar4;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
  ::
  RU_matrix<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
              *)&local_178,&local_2b8,pCVar4);
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_188 = "";
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x26d);
  plVar5 = (node_ptr)
           &local_178.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].column_;
  do {
    plVar5 = (((type *)&plVar5->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar5 == (node_ptr)
                  &local_178.reducedMatrixR_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3].column_) break;
  } while (*(int *)&plVar5[1].next_ != 1);
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "!m.is_zero_entry(3, 1)";
  local_2e0 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00255150;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1a8 = "";
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b8 = "";
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c0,0x26e);
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "!m.is_zero_column(3)";
  local_2e0 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00255150;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_1e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1d8 = "";
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  plVar5 = (node_ptr)
           &local_178.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].column_;
  do {
    plVar5 = (((type *)&plVar5->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar5 == (node_ptr)
                  &local_178.reducedMatrixR_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3].column_) goto LAB_0016bbfa;
  } while (*(int *)&plVar5[1].next_ != 1);
  plVar1 = plVar5->next_;
  plVar2 = plVar5->prev_;
  plVar2->next_ = plVar1;
  plVar1->prev_ = plVar2;
  plVar5->next_ = (node_ptr)0x0;
  plVar5->prev_ = (node_ptr)0x0;
  Gudhi::
  Simple_object_pool<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>
  ::destroy(&(local_178.reducedMatrixR_.matrix_.
              super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[3].entryPool_)->entryPool_,
            (pointer)&plVar5[-1].prev_);
LAB_0016bbfa:
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e8 = "";
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f0,0x270);
  plVar5 = (node_ptr)
           &local_178.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].column_;
  do {
    plVar5 = (((type *)&plVar5->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar5 == (node_ptr)
                  &local_178.reducedMatrixR_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3].column_) break;
  } while (*(int *)&plVar5[1].next_ != 1);
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "m.is_zero_entry(3, 1)";
  local_2e0 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00255150;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_208 = "";
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_218 = "";
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_220,0x271);
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "!m.is_zero_column(3)";
  local_2e0 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00255150;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_240 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_238 = "";
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  boost::intrusive::
  list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
  ::
  clear_and_dispose<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>::Delete_disposer>
            ((list_impl<boost::intrusive::bhtraits<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>,boost::intrusive::list_node_traits<void*>,(boost::intrusive::link_mode_type)1,Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>::Matrix_column_tag,1u>,unsigned_long,false,void>
              *)&local_178.reducedMatrixR_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[3].column_,
             local_178.reducedMatrixR_.matrix_.
             super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 3);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_250,0x273);
  plVar5 = (node_ptr)
           &local_178.reducedMatrixR_.matrix_.
            super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[3].column_;
  do {
    plVar5 = (((type *)&plVar5->next_)->data_).root_plus_size_.m_header.super_node.next_;
    if (plVar5 == (node_ptr)
                  &local_178.reducedMatrixR_.matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[3].column_) break;
  } while (*(int *)&plVar5[1].next_ != 1);
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "m.is_zero_entry(3, 1)";
  local_2e0 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00255150;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_270 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_268 = "";
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x274);
  sStack_2f0.pi_ = (sp_counted_base *)0x0;
  local_2e8 = "m.is_zero_column(3)";
  local_2e0 = "";
  local_2d0 = 0;
  local_2d8 = &PTR__lazy_ostream_00255150;
  local_2c8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_298 = "";
  local_2c0 = &local_2e8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2f0);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::reset(&local_178,local_180);
  pCVar4 = local_180;
  if (local_180 != (Column_settings *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)&local_180->entryConstructor);
    puVar3 = (pCVar4->operators).inverse_.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (puVar3 != (pointer)0x0) {
      operator_delete(puVar3,(long)(pCVar4->operators).inverse_.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3)
      ;
    }
  }
  operator_delete(pCVar4,0x58);
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  ::~RU_matrix(&local_178);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector(&local_2b8);
  return;
}

Assistant:

void test_zeroing() {
  auto orderedBoundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  Matrix m(orderedBoundaries, 5);

  BOOST_CHECK(!m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_entry(3, 1);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(!m.is_zero_column(3));
  m.zero_column(3);
  BOOST_CHECK(m.is_zero_entry(3, 1));
  BOOST_CHECK(m.is_zero_column(3));
}